

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_SubDLimitMeshSealEdgeInfo * __thiscall
ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::SetCapacity
          (ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *this,size_t new_capacity)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar3;
  ON_SubDLimitMeshSealEdgeInfo *pOVar2;
  
  if (this->m_capacity == 0) {
    this->m_a = (ON_SubDLimitMeshSealEdgeInfo *)0x0;
    this->m_count = 0;
  }
  uVar3 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar3 = 0;
  }
  if (uVar3 != this->m_capacity) {
    if ((int)uVar3 < 1) {
      if (this->m_a != (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
        (*this->_vptr_ON_SimpleArray[3])(this,this->m_a,0);
        this->m_a = (ON_SubDLimitMeshSealEdgeInfo *)0x0;
        this->m_count = 0;
        this->m_capacity = 0;
      }
    }
    else {
      if ((int)uVar3 < this->m_count) {
        this->m_count = uVar3;
      }
      iVar1 = (*this->_vptr_ON_SimpleArray[3])(this,this->m_a,(ulong)uVar3);
      pOVar2 = (ON_SubDLimitMeshSealEdgeInfo *)CONCAT44(extraout_var,iVar1);
      this->m_a = pOVar2;
      if (pOVar2 == (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
        this->m_count = 0;
        this->m_capacity = 0;
      }
      else {
        iVar1 = this->m_capacity;
        if (iVar1 < (int)uVar3) {
          memset(pOVar2 + iVar1,0,(long)(int)(uVar3 - iVar1) << 4);
        }
        this->m_capacity = uVar3;
      }
    }
  }
  return this->m_a;
}

Assistant:

T* ON_SimpleArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }

  // sets capacity to input value
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX) 
               ? (int)new_capacity 
               : 0;
  if ( capacity != m_capacity ) {
    if( capacity > 0 ) {
      if ( m_count > capacity )
        m_count = capacity;
      // NOTE: Realloc() does an allocation if the first argument is nullptr.
      m_a = Realloc( m_a, capacity );
      if ( m_a ) {
        if ( capacity > m_capacity ) {
          // zero new memory
          memset( (void*) (m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
        }
        m_capacity = capacity;
      }
      else {
        // out of memory
        m_count = m_capacity = 0;
      }
    }
    else if (m_a) {
      Realloc(m_a,0);
      m_a = 0;
      m_count = m_capacity = 0;
    }
  }
  return m_a;
}